

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.hpp
# Opt level: O3

void boost::deflate::detail::crc32_integral<unsigned_int,4>(uint v,uint32_t *crc)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  array<unsigned_char,_4UL> arr;
  
  puVar2 = arr._M_elems;
  lVar3 = 0;
  do {
    *puVar2 = (char)(v >> ((byte)lVar3 & 0x1f));
    lVar3 = lVar3 + 8;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 0x20);
  uVar1 = ~*crc;
  lVar3 = 0;
  do {
    uVar1 = uVar1 >> 8 ^ *(uint *)(crc32_tab + (ulong)(byte)(arr._M_elems[lVar3] ^ (byte)uVar1) * 4)
    ;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *crc = ~uVar1;
  return;
}

Assistant:

void crc32_integral(T v, std::uint32_t& crc) {
    static_assert(std::is_integral<T>::value, "T must be an integral type");
    std::array<unsigned char, I> arr;
    for(int i = 0; i < I; ++i)
        arr[i] = (v >> (i * 8));
    crc = crc32(arr.data(), I, crc);
}